

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O0

void __thiscall t_d_generator::generate_enum(t_d_generator *this,t_enum *tenum)

{
  bool bVar1;
  int iVar2;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *__x;
  string *psVar3;
  ostream *poVar4;
  reference pptVar5;
  string local_c0;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_a0;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_98;
  t_enum_value **local_90;
  __normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_88;
  const_iterator c_iter;
  undefined1 local_60 [8];
  string enum_name;
  undefined1 local_30 [8];
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  t_enum *tenum_local;
  t_d_generator *this_local;
  
  constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)tenum;
  __x = t_enum::get_constants(tenum);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)local_30,__x);
  emit_doc(this,(t_doc *)constants.
                         super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage,(ostream *)&this->f_types_);
  psVar3 = (string *)
           (*(code *)((*constants.
                        super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage)->super_t_doc).doc_.field_2.
                     _M_allocated_capacity)();
  suffix_if_reserved((string *)local_60,psVar3);
  t_generator::indent_abi_cxx11_((string *)&c_iter,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)&this->f_types_,(string *)&c_iter);
  poVar4 = std::operator<<(poVar4,"enum ");
  poVar4 = std::operator<<(poVar4,(string *)local_60);
  poVar4 = std::operator<<(poVar4," {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&c_iter);
  t_generator::indent_up((t_generator *)this);
  __gnu_cxx::
  __normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  ::__normal_iterator(&local_88);
  local_98._M_current =
       (t_enum_value **)
       std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                 ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)local_30);
  __gnu_cxx::
  __normal_iterator<t_enum_value*const*,std::vector<t_enum_value*,std::allocator<t_enum_value*>>>::
  __normal_iterator<t_enum_value**>
            ((__normal_iterator<t_enum_value*const*,std::vector<t_enum_value*,std::allocator<t_enum_value*>>>
              *)&local_90,&local_98);
  local_88._M_current = local_90;
  while( true ) {
    local_a0._M_current =
         (t_enum_value **)
         std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end
                   ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)local_30);
    bVar1 = __gnu_cxx::operator!=(&local_88,&local_a0);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_88);
    emit_doc(this,&(*pptVar5)->super_t_doc,(ostream *)&this->f_types_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_types_);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_88);
    psVar3 = t_enum_value::get_name_abi_cxx11_(*pptVar5);
    suffix_if_reserved(&local_c0,psVar3);
    std::operator<<(poVar4,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    poVar4 = std::operator<<((ostream *)&this->f_types_," = ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_88);
    iVar2 = t_enum_value::get_value(*pptVar5);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    std::operator<<(poVar4,",");
    __gnu_cxx::
    __normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
    ::operator++(&local_88);
  }
  std::operator<<((ostream *)&this->f_types_,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_types_);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)&this->f_types_,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_60);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)local_30);
  return;
}

Assistant:

void generate_enum(t_enum* tenum) override {
    vector<t_enum_value*> constants = tenum->get_constants();

    this->emit_doc(tenum, f_types_);
    string enum_name = suffix_if_reserved(tenum->get_name());
    f_types_ << indent() << "enum " << enum_name << " {" << endl;

    indent_up();

    vector<t_enum_value*>::const_iterator c_iter;
    for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
      this->emit_doc(*c_iter, f_types_);
      indent(f_types_) << suffix_if_reserved((*c_iter)->get_name());
      f_types_ << " = " << (*c_iter)->get_value() << ",";
    }

    f_types_ << endl;
    indent_down();
    indent(f_types_) << "}" << endl;

    f_types_ << endl;
  }